

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR cast_string_realloc(ly_ctx *ctx,uint64_t needed,char **str,uint32_t *used,uint32_t *size)

{
  char *pcVar1;
  uint32_t *size_local;
  uint32_t *used_local;
  char **str_local;
  uint64_t needed_local;
  ly_ctx *ctx_local;
  
  if (*size - *used < needed) {
    do {
      if (-*size - 1 < 0x10) {
        ly_log(ctx,LY_LLERR,LY_EINVAL,"XPath string length limit (%u) reached.",0xffffffff);
        return LY_EINVAL;
      }
      *size = *size + 0x10;
    } while (*size - *used < needed);
    pcVar1 = (char *)ly_realloc(*str,(ulong)*size);
    *str = pcVar1;
    if (*str == (char *)0x0) {
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","cast_string_realloc");
      return LY_EMEM;
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
cast_string_realloc(const struct ly_ctx *ctx, uint64_t needed, char **str, uint32_t *used, uint32_t *size)
{
    if (*size - (unsigned)*used < needed) {
        do {
            if ((UINT32_MAX - *size) < LYXP_STRING_CAST_SIZE_STEP) {
                LOGERR(ctx, LY_EINVAL, "XPath string length limit (%" PRIu32 ") reached.", UINT32_MAX);
                return LY_EINVAL;
            }
            *size += LYXP_STRING_CAST_SIZE_STEP;
        } while (*size - (unsigned)*used < needed);
        *str = ly_realloc(*str, *size * sizeof(char));
        LY_CHECK_ERR_RET(!(*str), LOGMEM(ctx), LY_EMEM);
    }

    return LY_SUCCESS;
}